

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void __thiscall btLCP::transfer_i_from_N_to_C(btLCP *this,int i)

{
  uint n;
  btScalar *pbVar1;
  btScalar *pbVar2;
  int *piVar3;
  btScalar *pbVar4;
  btScalar *b;
  int iVar5;
  btScalar *aptr;
  ulong uVar6;
  btScalar **A;
  ulong uVar7;
  float fVar8;
  btScalar bVar9;
  int in_stack_ffffffffffffffd0;
  
  iVar5 = this->m_nC;
  A = this->m_A;
  pbVar1 = A[i];
  if ((long)iVar5 < 1) {
    *this->m_d = 1.0 / pbVar1[i];
  }
  else {
    pbVar2 = this->m_Dell;
    piVar3 = this->m_C;
    uVar7 = 0;
    uVar6 = (ulong)(uint)this->m_nub;
    if (this->m_nub < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pbVar2[uVar7] = pbVar1[uVar7];
    }
    for (; uVar6 < (ulong)(long)iVar5; uVar6 = uVar6 + 1) {
      pbVar2[uVar6] = pbVar1[piVar3[uVar6]];
    }
    btSolveL1(this->m_L,pbVar2,iVar5,this->m_nskip);
    n = this->m_nC;
    iVar5 = this->m_nskip;
    pbVar1 = this->m_L;
    pbVar2 = this->m_ell;
    pbVar4 = this->m_d;
    b = this->m_Dell;
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)n) {
      uVar7 = (ulong)n;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      fVar8 = b[uVar6] * pbVar4[uVar6];
      pbVar2[uVar6] = fVar8;
      pbVar1[(long)(int)(iVar5 * n) + uVar6] = fVar8;
    }
    fVar8 = this->m_A[i][i];
    in_stack_ffffffffffffffd0 = 0x194d14;
    bVar9 = btLargeDot(pbVar2,b,n);
    this->m_d[(int)n] = 1.0 / (fVar8 - bVar9);
    A = this->m_A;
    iVar5 = this->m_nC;
  }
  btSwapProblem(A,this->m_x,this->m_b,this->m_w,this->m_lo,this->m_hi,this->m_p,this->m_state,
                this->m_findex,this->m_n,iVar5,i,1,in_stack_ffffffffffffffd0);
  iVar5 = this->m_nC;
  this->m_C[iVar5] = iVar5;
  this->m_nN = this->m_nN + -1;
  this->m_nC = iVar5 + 1;
  return;
}

Assistant:

void btLCP::transfer_i_from_N_to_C (int i)
{
  {
    if (m_nC > 0) {
      {
        btScalar *const aptr = BTAROW(i);
        btScalar *Dell = m_Dell;
        const int *C = m_C;
#   ifdef BTNUB_OPTIMIZATIONS
        // if nub>0, initial part of aptr unpermuted
        const int nub = m_nub;
        int j=0;
        for ( ; j<nub; ++j) Dell[j] = aptr[j];
        const int nC = m_nC;
        for ( ; j<nC; ++j) Dell[j] = aptr[C[j]];
#   else
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) Dell[j] = aptr[C[j]];
#   endif
      }
      btSolveL1 (m_L,m_Dell,m_nC,m_nskip);
      {
        const int nC = m_nC;
        btScalar *const Ltgt = m_L + nC*m_nskip;
        btScalar *ell = m_ell, *Dell = m_Dell, *d = m_d;
        for (int j=0; j<nC; ++j) Ltgt[j] = ell[j] = Dell[j] * d[j];
      }
      const int nC = m_nC;
      m_d[nC] = btRecip (BTAROW(i)[i] - btLargeDot(m_ell,m_Dell,nC));
    }
    else {
      m_d[0] = btRecip (BTAROW(i)[i]);
    }

    btSwapProblem (m_A,m_x,m_b,m_w,m_lo,m_hi,m_p,m_state,m_findex,m_n,m_nC,i,m_nskip,1);

    const int nC = m_nC;
    m_C[nC] = nC;
    m_nN--;
    m_nC = nC + 1; // nC value is outdated after this line
  }

  // @@@ TO DO LATER
  // if we just finish here then we'll go back and re-solve for
  // delta_x. but actually we can be more efficient and incrementally
  // update delta_x here. but if we do this, we wont have ell and Dell
  // to use in updating the factorization later.

}